

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_div(sexp ctx,sexp a,sexp b)

{
  sexp *ppsVar1;
  sexp *ppsVar2;
  sexp *ppsVar3;
  sexp *ppsVar4;
  sexp *ppsVar5;
  sexp *ppsVar6;
  uint uVar7;
  sexp psVar8;
  uint uVar9;
  double dVar10;
  sexp tmp;
  sexp local_38;
  double local_30;
  sexp_gc_var_t local_28;
  
  local_28.var = &local_38;
  if (((ulong)a & 3) == 0) {
    uVar7 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar7 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar7 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar9 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar9 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar9 = (uint)b & 1;
  }
  local_38 = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  psVar8 = (sexp)&DAT_0000043e;
  ppsVar1 = &local_38;
  ppsVar2 = &local_38;
  ppsVar3 = &local_38;
  ppsVar4 = &local_38;
  ppsVar5 = &local_38;
  ppsVar6 = &local_38;
  switch(uVar9 + uVar7 * 6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    b = a;
    goto LAB_0011b240;
  case 6:
  case 0xc:
  case 0x12:
  case 0x18:
LAB_0011b240:
    local_28.var = &local_38;
    psVar8 = sexp_type_exception(ctx,(sexp)0x0,3,b);
    break;
  case 7:
  case 9:
  case 0x13:
  case 0x15:
    local_28.var = &local_38;
    local_38 = sexp_make_ratio(ctx,a,b);
    psVar8 = sexp_ratio_normalize(ctx,local_38,(sexp)&DAT_0000003e);
    break;
  case 8:
    dVar10 = (double)((long)a >> 1);
    local_28.var = &local_38;
    goto LAB_0011b37e;
  case 0xd:
    dVar10 = (a->value).flonum / (double)((long)b >> 1);
    local_28.var = &local_38;
    goto LAB_0011b3b1;
  case 0xe:
    dVar10 = (a->value).flonum;
    local_28.var = &local_38;
    goto LAB_0011b37e;
  case 0xf:
    local_30 = (a->value).flonum;
    local_28.var = &local_38;
    dVar10 = sexp_bignum_to_double(b);
    goto LAB_0011b3a0;
  case 0x10:
    local_30 = (a->value).flonum;
    local_28.var = &local_38;
    dVar10 = sexp_ratio_to_double(ctx,b);
LAB_0011b3a0:
    dVar10 = local_30 / dVar10;
    goto LAB_0011b3b1;
  case 0x14:
    local_28.var = &local_38;
    dVar10 = sexp_bignum_to_double(a);
    goto LAB_0011b37e;
  case 0x19:
  case 0x1b:
    local_28.var = &local_38;
    b = sexp_make_ratio(ctx,b,(sexp)&DAT_00000003);
    local_38 = b;
    ppsVar4 = local_28.var;
  case 10:
  case 0x16:
    local_28.var = ppsVar4;
    if ((((ulong)a & 3) != 0) || (ppsVar2 = local_28.var, a->tag != 0xd)) {
      a = sexp_make_ratio(ctx,a,(sexp)&DAT_00000003);
      local_38 = a;
      ppsVar2 = local_28.var;
    }
  case 0x1c:
    local_28.var = ppsVar2;
    psVar8 = sexp_ratio_div(ctx,a,b);
    break;
  case 0x1a:
    local_28.var = &local_38;
    dVar10 = sexp_ratio_to_double(ctx,a);
LAB_0011b37e:
    dVar10 = dVar10 / (b->value).flonum;
LAB_0011b3b1:
    psVar8 = sexp_make_flonum(ctx,dVar10);
    break;
  case 0x22:
    dVar10 = sexp_ratio_to_double(ctx,b);
    b = sexp_make_flonum(ctx,dVar10);
    local_38 = b;
    ppsVar6 = local_28.var;
  case 0x1f:
  case 0x20:
  case 0x21:
    local_28.var = ppsVar6;
    b = sexp_make_complex(ctx,b,(sexp)&DAT_00000001);
    local_38 = b;
    ppsVar5 = local_28.var;
  case 0x1d:
    local_28.var = ppsVar5;
    ppsVar1 = local_28.var;
    if ((((ulong)a & 3) == 0) && (a->tag == 0xd)) {
      dVar10 = sexp_ratio_to_double(ctx,a);
      a = sexp_make_flonum(ctx,dVar10);
      local_38 = a;
      ppsVar1 = local_28.var;
    }
  case 0xb:
  case 0x11:
  case 0x17:
    local_28.var = ppsVar1;
    if ((((ulong)a & 3) != 0) || (ppsVar3 = local_28.var, a->tag != 0xe)) {
      a = sexp_make_complex(ctx,a,(sexp)&DAT_00000001);
      local_38 = a;
      ppsVar3 = local_28.var;
    }
  case 0x23:
    local_28.var = ppsVar3;
    psVar8 = sexp_complex_div(ctx,a,b);
  }
  (ctx->value).context.saves = local_28.next;
  return psVar8;
}

Assistant:

sexp sexp_div (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
#if ! SEXP_USE_RATIOS
  double f;
#endif
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_NOT: case SEXP_NUM_FLO_NOT: case SEXP_NUM_BIG_NOT:
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_NOT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, b);
    break;
  case SEXP_NUM_FIX_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    f = sexp_fixnum_to_double(a) / sexp_fixnum_to_double(b);
    r = ((f == trunc(f)) ? sexp_make_fixnum((sexp_sint_t)f)
         : sexp_make_flonum(ctx, f));
#endif
    break;
  case SEXP_NUM_FIX_FLO:
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_make_flonum(ctx, sexp_fixnum_to_double(a)/sexp_bignum_to_double(b));
#endif
    break;
  case SEXP_NUM_FLO_FIX:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a)/sexp_fixnum_to_double(b));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_div(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_FIX:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
    break;
#else
    b = tmp = sexp_fixnum_to_bignum(ctx, b);
#endif
    /* ... FALLTHROUGH if ! SEXP_USE_RATIOS ... */
  case SEXP_NUM_BIG_BIG:
#if SEXP_USE_RATIOS
    tmp = sexp_make_ratio(ctx, a, b);
    r = sexp_ratio_normalize(ctx, tmp, SEXP_FALSE);
#else
    r = sexp_bignum_quot_rem(ctx, &tmp, a, b);
    if (sexp_bignum_normalize(tmp) != SEXP_ZERO)
      r = sexp_make_flonum(ctx, sexp_bignum_to_double(a)
                           / sexp_bignum_to_double(b));
    else
      r = sexp_bignum_normalize(r);
#endif
    break;
  case SEXP_NUM_BIG_FLO:
    r = sexp_make_flonum(ctx, sexp_bignum_to_double(a) / sexp_flonum_value(b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) / sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_RAT_FLO:
    r = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a) / sexp_flonum_value(b));
    break;
  case SEXP_NUM_RAT_FIX:
  case SEXP_NUM_RAT_BIG:
    b = tmp = sexp_make_ratio(ctx, b, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    if (!sexp_ratiop(a))
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_div(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_CPX_RAT:
    b = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, b));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_CPX_FLO:
  case SEXP_NUM_CPX_FIX:
  case SEXP_NUM_CPX_BIG:
    b = tmp = sexp_make_complex(ctx, b, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
    if (sexp_ratiop(a))
      a = tmp = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, a));
    /* ... FALLTHROUGH ... */
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    if (!sexp_complexp(a))
      a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_div(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}